

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat3 * dja::mat3::rotation(mat3 *__return_storage_ptr__,quaternion *q)

{
  float_t *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float_t ii2;
  float_t ri2;
  float_t rj2;
  float_t rk2;
  float_t kk2;
  float_t jk2;
  float_t ik2;
  float_t ij2;
  float_t jj2;
  quaternion *q_local;
  
  pfVar1 = quaternion::operator[](q,2);
  fVar10 = *pfVar1;
  pfVar1 = quaternion::operator[](q,2);
  fVar2 = fVar10 * 2.0 * *pfVar1;
  pfVar1 = quaternion::operator[](q,1);
  fVar10 = *pfVar1;
  pfVar1 = quaternion::operator[](q,2);
  fVar3 = fVar10 * 2.0 * *pfVar1;
  pfVar1 = quaternion::operator[](q,1);
  fVar10 = *pfVar1;
  pfVar1 = quaternion::operator[](q,3);
  fVar4 = fVar10 * 2.0 * *pfVar1;
  pfVar1 = quaternion::operator[](q,2);
  fVar10 = *pfVar1;
  pfVar1 = quaternion::operator[](q,3);
  fVar5 = fVar10 * 2.0 * *pfVar1;
  pfVar1 = quaternion::operator[](q,3);
  fVar10 = *pfVar1;
  pfVar1 = quaternion::operator[](q,3);
  fVar6 = fVar10 * 2.0 * *pfVar1;
  pfVar1 = quaternion::operator[](q,0);
  fVar10 = *pfVar1;
  pfVar1 = quaternion::operator[](q,3);
  fVar7 = fVar10 * 2.0 * *pfVar1;
  pfVar1 = quaternion::operator[](q,0);
  fVar10 = *pfVar1;
  pfVar1 = quaternion::operator[](q,2);
  fVar8 = fVar10 * 2.0 * *pfVar1;
  pfVar1 = quaternion::operator[](q,0);
  fVar10 = *pfVar1;
  pfVar1 = quaternion::operator[](q,1);
  fVar9 = fVar10 * 2.0 * *pfVar1;
  pfVar1 = quaternion::operator[](q,1);
  fVar10 = *pfVar1;
  pfVar1 = quaternion::operator[](q,1);
  fVar10 = fVar10 * 2.0 * *pfVar1;
  mat3(__return_storage_ptr__,(1.0 - fVar2) - fVar6,fVar3 + fVar7,fVar4 - fVar8,fVar3 - fVar7,
       (1.0 - fVar10) - fVar6,fVar5 + fVar9,fVar4 + fVar8,fVar5 - fVar9,(1.0 - fVar10) - fVar2);
  return __return_storage_ptr__;
}

Assistant:

mat3 mat3::rotation(const quaternion& q)
{
    float_t jj2 = float_t(2) * q[2] * q[2];
    float_t ij2 = float_t(2) * q[1] * q[2];
    float_t ik2 = float_t(2) * q[1] * q[3];
    float_t jk2 = float_t(2) * q[2] * q[3];
    float_t kk2 = float_t(2) * q[3] * q[3];
    float_t rk2 = float_t(2) * q[0] * q[3];
    float_t rj2 = float_t(2) * q[0] * q[2];
    float_t ri2 = float_t(2) * q[0] * q[1];
    float_t ii2 = float_t(2) * q[1] * q[1];

    return mat3(float_t(1) - jj2 - kk2, ij2 + rk2, ik2 - rj2,
                ij2 - rk2, float_t(1) - ii2 - kk2, jk2 + ri2,
                ik2 + rj2, jk2 - ri2, float_t(1) - ii2 - jj2);
}